

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O0

Nullable<CordRep_*>
absl::lts_20240722::NewTree(Nullable<const_char_*> data,size_t length,size_t alloc_hint)

{
  size_t alloc_hint_local;
  size_t length_local;
  Nullable<const_char_*> data_local;
  
  if (length == 0) {
    data_local = (Nullable<const_char_*>)0x0;
  }
  else {
    data_local = (Nullable<const_char_*>)NewBtree(data,length,alloc_hint);
  }
  return (Nullable<CordRep_*>)data_local;
}

Assistant:

static absl::Nullable<CordRep*> NewTree(absl::Nullable<const char*> data,
                                        size_t length, size_t alloc_hint) {
  if (length == 0) return nullptr;
  return NewBtree(data, length, alloc_hint);
}